

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O3

void __thiscall
cmLocalGenerator::GetTargetFlags
          (cmLocalGenerator *this,cmLinkLineComputer *linkLineComputer,string *config,
          string *linkLibs,string *flags,string *linkFlags,string *frameworkPath,string *linkPath,
          cmGeneratorTarget *target)

{
  size_type *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  cmMakefile *pcVar4;
  pointer pcVar5;
  cmSourceFile *this_00;
  size_type sVar6;
  bool bVar7;
  TargetType TVar8;
  int iVar9;
  string *psVar10;
  long *plVar11;
  undefined8 *puVar12;
  long *plVar13;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  pointer *pppcVar14;
  undefined8 uVar15;
  pointer ppcVar16;
  string *opt;
  char *pcVar17;
  _Alloc_hider _Var18;
  char *__end;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  opts;
  string buildType;
  string linkLanguage;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> sources;
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  cmComputeLinkInformation *local_98;
  string *local_90;
  string local_88;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> local_68;
  cmLinkLineComputer *local_48;
  string *local_40;
  cmOutputConverter *local_38;
  
  local_40 = linkLibs;
  cmsys::SystemTools::UpperCase(&local_b8,config);
  local_90 = config;
  local_98 = cmGeneratorTarget::GetLinkInformation(target,config);
  local_48 = linkLineComputer;
  (*linkLineComputer->_vptr_cmLinkLineComputer[4])(&local_88,linkLineComputer,target,&local_b8);
  TVar8 = cmGeneratorTarget::GetType(target);
  switch(TVar8) {
  case EXECUTABLE:
    iVar9 = std::__cxx11::string::compare((char *)&local_88);
    if (iVar9 != 0) {
      pcVar4 = this->Makefile;
      paVar2 = &local_118.field_2;
      local_118._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_118,"CMAKE_EXE_LINKER_FLAGS","");
      psVar10 = cmMakefile::GetSafeDefinition(pcVar4,&local_118);
      std::__cxx11::string::_M_append((char *)linkFlags,(ulong)(psVar10->_M_dataplus)._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != paVar2) {
        operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::append((char *)linkFlags);
      if (local_b8._M_string_length != 0) {
        local_118._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_118,"CMAKE_EXE_LINKER_FLAGS_","");
        std::__cxx11::string::_M_append((char *)&local_118,(ulong)local_b8._M_dataplus._M_p);
        psVar10 = cmMakefile::GetSafeDefinition(this->Makefile,&local_118);
        std::__cxx11::string::_M_append((char *)linkFlags,(ulong)(psVar10->_M_dataplus)._M_p);
        std::__cxx11::string::append((char *)linkFlags);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_dataplus._M_p != paVar2) {
          operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
        }
      }
      if (local_88._M_string_length == 0) {
        psVar10 = cmGeneratorTarget::GetName_abi_cxx11_(target);
        std::operator+(&local_118,"CMake can not determine linker language for target: ",psVar10);
        cmSystemTools::Error(&local_118);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_dataplus._M_p != paVar2) {
          operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
        }
        goto LAB_001b4499;
      }
      local_118._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"WIN32_EXECUTABLE","");
      bVar7 = cmGeneratorTarget::GetPropertyAsBool(target,&local_118);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != paVar2) {
        operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
      }
      pcVar4 = this->Makefile;
      if (bVar7) {
        local_118._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_118,"CMAKE_CREATE_WIN32_EXE","");
        psVar10 = cmMakefile::GetSafeDefinition(pcVar4,&local_118);
        std::__cxx11::string::_M_append((char *)linkFlags,(ulong)(psVar10->_M_dataplus)._M_p);
      }
      else {
        local_118._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_118,"CMAKE_CREATE_CONSOLE_EXE","");
        psVar10 = cmMakefile::GetSafeDefinition(pcVar4,&local_118);
        std::__cxx11::string::_M_append((char *)linkFlags,(ulong)(psVar10->_M_dataplus)._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != paVar2) {
        operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::append((char *)linkFlags);
      bVar7 = cmGeneratorTarget::IsExecutableWithExports(target);
      if (bVar7) {
        local_118._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_118,"CMAKE_EXE_EXPORTS_","");
        std::__cxx11::string::_M_append((char *)&local_118,(ulong)local_88._M_dataplus._M_p);
        std::__cxx11::string::append((char *)&local_118);
        psVar10 = cmMakefile::GetSafeDefinition(this->Makefile,&local_118);
        std::__cxx11::string::_M_append((char *)linkFlags,(ulong)(psVar10->_M_dataplus)._M_p);
        std::__cxx11::string::append((char *)linkFlags);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_dataplus._M_p != paVar2) {
          operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
        }
      }
    }
    AddLanguageFlagsForLinking(this,flags,target,&local_88,&local_b8);
    if (local_98 != (cmComputeLinkInformation *)0x0) {
      OutputLinkLibraries(this,local_98,local_48,local_40,frameworkPath,linkPath);
    }
    pcVar4 = this->Makefile;
    paVar2 = &local_118.field_2;
    local_118._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"BUILD_SHARED_LIBS","");
    pcVar17 = cmMakefile::GetDefinition(pcVar4,&local_118);
    bVar7 = cmSystemTools::IsOn(pcVar17);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != paVar2) {
      operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
    }
    if (bVar7) {
      local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"CMAKE_SHARED_BUILD_","");
      plVar11 = (long *)std::__cxx11::string::_M_append
                                  ((char *)&local_d8,(ulong)local_88._M_dataplus._M_p);
      paVar3 = &local_f8.field_2;
      plVar13 = plVar11 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar11 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)plVar13) {
        local_f8.field_2._M_allocated_capacity = *plVar13;
        local_f8.field_2._8_4_ = (undefined4)plVar11[3];
        local_f8.field_2._12_4_ = *(undefined4 *)((long)plVar11 + 0x1c);
        local_f8._M_dataplus._M_p = (pointer)paVar3;
      }
      else {
        local_f8.field_2._M_allocated_capacity = *plVar13;
        local_f8._M_dataplus._M_p = (pointer)*plVar11;
      }
      local_f8._M_string_length = plVar11[1];
      *plVar11 = (long)plVar13;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      pppcVar14 = &local_68.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
      local_68.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)pppcVar14;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"_FLAGS","");
      uVar15 = (pointer)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != paVar3) {
        uVar15 = local_f8.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar15 <
          (pointer)((long)local_68.
                          super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                          _M_impl.super__Vector_impl_data._M_finish + local_f8._M_string_length)) {
        ppcVar16 = (pointer)0xf;
        if (local_68.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)pppcVar14) {
          ppcVar16 = local_68.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage;
        }
        if (ppcVar16 <
            (pointer)((long)local_68.
                            super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish + local_f8._M_string_length))
        goto LAB_001b47b9;
        puVar12 = (undefined8 *)
                  std::__cxx11::string::replace
                            ((ulong)&local_68,0,(char *)0x0,(ulong)local_f8._M_dataplus._M_p);
      }
      else {
LAB_001b47b9:
        puVar12 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_f8,
                             (ulong)local_68.
                                    super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
      }
      psVar1 = puVar12 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar12 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar1) {
        local_118.field_2._M_allocated_capacity = *psVar1;
        local_118.field_2._8_8_ = puVar12[3];
        local_118._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_118.field_2._M_allocated_capacity = *psVar1;
        local_118._M_dataplus._M_p = (pointer)*puVar12;
      }
      local_118._M_string_length = puVar12[1];
      *puVar12 = psVar1;
      puVar12[1] = 0;
      *(undefined1 *)psVar1 = 0;
      if (local_68.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)pppcVar14) {
        operator_delete(local_68.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (ulong)((long)local_68.
                                      super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != paVar3) {
        operator_delete(local_f8._M_dataplus._M_p,
                        (ulong)(local_f8.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
      }
      psVar10 = cmMakefile::GetSafeDefinition(this->Makefile,&local_118);
      std::__cxx11::string::_M_append((char *)linkFlags,(ulong)(psVar10->_M_dataplus)._M_p);
      std::__cxx11::string::append((char *)linkFlags);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != paVar2) {
        operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
      }
    }
    GetLinkLibsCMP0065(&local_118,this,&local_88,target);
    if ((undefined8 *)local_118._M_string_length != (undefined8 *)0x0) {
      std::__cxx11::string::_M_append((char *)linkFlags,(ulong)local_118._M_dataplus._M_p);
      std::__cxx11::string::append((char *)linkFlags);
    }
    paVar3 = &local_f8.field_2;
    local_f8._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"LINK_FLAGS","");
    pcVar17 = cmGeneratorTarget::GetProperty(target,&local_f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != paVar3) {
      operator_delete(local_f8._M_dataplus._M_p,(ulong)(local_f8.field_2._M_allocated_capacity + 1))
      ;
    }
    if (pcVar17 != (char *)0x0) {
      std::__cxx11::string::append((char *)linkFlags);
      std::__cxx11::string::append((char *)linkFlags);
    }
    if (local_b8._M_string_length != 0) {
      local_f8._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"LINK_FLAGS_","");
      std::__cxx11::string::_M_append((char *)&local_f8,(ulong)local_b8._M_dataplus._M_p);
      pcVar17 = cmGeneratorTarget::GetProperty(target,&local_f8);
      if (pcVar17 != (char *)0x0) {
        std::__cxx11::string::append((char *)linkFlags);
        std::__cxx11::string::append((char *)linkFlags);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != paVar3) {
        operator_delete(local_f8._M_dataplus._M_p,
                        (ulong)(local_f8.field_2._M_allocated_capacity + 1));
      }
    }
    local_f8._M_dataplus._M_p = (pointer)0x0;
    local_f8._M_string_length = 0;
    local_f8.field_2._M_allocated_capacity = 0;
    cmGeneratorTarget::GetLinkOptions
              (target,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_f8,local_90,&local_88);
    sVar6 = local_f8._M_string_length;
    for (_Var18._M_p = local_f8._M_dataplus._M_p; _Var18._M_p != (pointer)sVar6;
        _Var18._M_p = _Var18._M_p + 0x20) {
      (*this->_vptr_cmLocalGenerator[8])(this,linkFlags,_Var18._M_p);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != paVar2) {
      operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
    }
    break;
  case STATIC_LIBRARY:
    GetStaticLibraryFlags(this,linkFlags,&local_b8,&local_88,target);
    break;
  case SHARED_LIBRARY:
    pcVar17 = "CMAKE_SHARED_LINKER_FLAGS";
    goto LAB_001b3f00;
  case MODULE_LIBRARY:
    pcVar17 = "CMAKE_MODULE_LINKER_FLAGS";
LAB_001b3f00:
    iVar9 = std::__cxx11::string::compare((char *)&local_88);
    if (iVar9 != 0) {
      pcVar4 = this->Makefile;
      local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,pcVar17,pcVar17 + 0x19);
      cmMakefile::GetSafeDefinition(pcVar4,&local_118);
      std::__cxx11::string::_M_assign((string *)linkFlags);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::append((char *)linkFlags);
      if (local_b8._M_string_length != 0) {
        local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,pcVar17,pcVar17 + 0x19)
        ;
        std::__cxx11::string::append((char *)&local_118);
        std::__cxx11::string::_M_append((char *)&local_118,(ulong)local_b8._M_dataplus._M_p);
        psVar10 = cmMakefile::GetSafeDefinition(this->Makefile,&local_118);
        std::__cxx11::string::_M_append((char *)linkFlags,(ulong)(psVar10->_M_dataplus)._M_p);
        std::__cxx11::string::append((char *)linkFlags);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_dataplus._M_p != &local_118.field_2) {
          operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
        }
      }
      pcVar4 = this->Makefile;
      local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"WIN32","");
      bVar7 = cmMakefile::IsOn(pcVar4,&local_118);
      if (bVar7) {
        pcVar4 = this->Makefile;
        local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"CYGWIN","");
        bVar7 = cmMakefile::IsOn(pcVar4,&local_f8);
        if (bVar7) {
          bVar7 = false;
        }
        else {
          pcVar4 = this->Makefile;
          local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"MINGW","");
          bVar7 = cmMakefile::IsOn(pcVar4,&local_d8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
            operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
          }
          bVar7 = !bVar7;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
          operator_delete(local_f8._M_dataplus._M_p,
                          (ulong)(local_f8.field_2._M_allocated_capacity + 1));
        }
      }
      else {
        bVar7 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
      }
      if (bVar7) {
        local_68.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_68.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_68.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        cmGeneratorTarget::GetSourceFiles(target,&local_68,&local_b8);
        pcVar4 = this->Makefile;
        local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_f8,"CMAKE_LINK_DEF_FILE_FLAG","");
        psVar10 = cmMakefile::GetSafeDefinition(pcVar4,&local_f8);
        local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
        pcVar5 = (psVar10->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_118,pcVar5,pcVar5 + psVar10->_M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
          operator_delete(local_f8._M_dataplus._M_p,
                          (ulong)(local_f8.field_2._M_allocated_capacity + 1));
        }
        ppcVar16 = local_68.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        if (local_68.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
            super__Vector_impl_data._M_start !=
            local_68.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          local_38 = &this->super_cmOutputConverter;
          pppcVar14 = (pointer *)
                      local_68.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                      _M_impl.super__Vector_impl_data._M_start;
          do {
            this_00 = (cmSourceFile *)*pppcVar14;
            psVar10 = cmSourceFile::GetExtension_abi_cxx11_(this_00);
            iVar9 = std::__cxx11::string::compare((char *)psVar10);
            if (iVar9 == 0) {
              std::__cxx11::string::_M_append((char *)linkFlags,(ulong)local_118._M_dataplus._M_p);
              psVar10 = cmSourceFile::GetFullPath(this_00,(string *)0x0);
              cmsys::SystemTools::CollapseFullPath(&local_d8,psVar10);
              cmOutputConverter::ConvertToOutputFormat(&local_f8,local_38,&local_d8,SHELL);
              std::__cxx11::string::_M_append((char *)linkFlags,(ulong)local_f8._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
                operator_delete(local_f8._M_dataplus._M_p,
                                (ulong)(local_f8.field_2._M_allocated_capacity + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
                operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1
                               );
              }
              std::__cxx11::string::append((char *)linkFlags);
            }
            pppcVar14 = pppcVar14 + 1;
          } while ((pointer)pppcVar14 != ppcVar16);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_dataplus._M_p != &local_118.field_2) {
          operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
        }
        if (local_68.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_68.
                          super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_68.
                                super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_68.
                                super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
      }
    }
    paVar2 = &local_118.field_2;
    local_118._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"LINK_FLAGS","");
    pcVar17 = cmGeneratorTarget::GetProperty(target,&local_118);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != paVar2) {
      operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
    }
    if (pcVar17 != (char *)0x0) {
      std::__cxx11::string::append((char *)linkFlags);
      std::__cxx11::string::append((char *)linkFlags);
    }
    if (local_b8._M_string_length != 0) {
      local_118._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"LINK_FLAGS_","");
      std::__cxx11::string::_M_append((char *)&local_118,(ulong)local_b8._M_dataplus._M_p);
      pcVar17 = cmGeneratorTarget::GetProperty(target,&local_118);
      if (pcVar17 != (char *)0x0) {
        std::__cxx11::string::append((char *)linkFlags);
        std::__cxx11::string::append((char *)linkFlags);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != paVar2) {
        operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
      }
    }
    local_118._M_dataplus._M_p = (pointer)0x0;
    local_118._M_string_length = 0;
    local_118.field_2._M_allocated_capacity = 0;
    cmGeneratorTarget::GetLinkOptions
              (target,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_118,local_90,&local_88);
    sVar6 = local_118._M_string_length;
    for (_Var18._M_p = local_118._M_dataplus._M_p; _Var18._M_p != (pointer)sVar6;
        _Var18._M_p = _Var18._M_p + 0x20) {
      (*this->_vptr_cmLocalGenerator[8])(this,linkFlags,_Var18._M_p);
    }
    if (local_98 != (cmComputeLinkInformation *)0x0) {
      OutputLinkLibraries(this,local_98,local_48,local_40,frameworkPath,linkPath);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_118);
  }
  AppendPositionIndependentLinkerFlags(this,linkFlags,target,local_90,&local_88);
  AppendIPOLinkerFlags(this,linkFlags,target,local_90,&local_88);
LAB_001b4499:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmLocalGenerator::GetTargetFlags(
  cmLinkLineComputer* linkLineComputer, const std::string& config,
  std::string& linkLibs, std::string& flags, std::string& linkFlags,
  std::string& frameworkPath, std::string& linkPath, cmGeneratorTarget* target)
{
  const std::string buildType = cmSystemTools::UpperCase(config);
  cmComputeLinkInformation* pcli = target->GetLinkInformation(config);
  const char* libraryLinkVariable =
    "CMAKE_SHARED_LINKER_FLAGS"; // default to shared library

  const std::string linkLanguage =
    linkLineComputer->GetLinkerLanguage(target, buildType);

  switch (target->GetType()) {
    case cmStateEnums::STATIC_LIBRARY:
      this->GetStaticLibraryFlags(linkFlags, buildType, linkLanguage, target);
      break;
    case cmStateEnums::MODULE_LIBRARY:
      libraryLinkVariable = "CMAKE_MODULE_LINKER_FLAGS";
      CM_FALLTHROUGH;
    case cmStateEnums::SHARED_LIBRARY: {
      if (linkLanguage != "Swift") {
        linkFlags = this->Makefile->GetSafeDefinition(libraryLinkVariable);
        linkFlags += " ";
        if (!buildType.empty()) {
          std::string build = libraryLinkVariable;
          build += "_";
          build += buildType;
          linkFlags += this->Makefile->GetSafeDefinition(build);
          linkFlags += " ";
        }
        if (this->Makefile->IsOn("WIN32") &&
            !(this->Makefile->IsOn("CYGWIN") ||
              this->Makefile->IsOn("MINGW"))) {
          std::vector<cmSourceFile*> sources;
          target->GetSourceFiles(sources, buildType);
          std::string defFlag =
            this->Makefile->GetSafeDefinition("CMAKE_LINK_DEF_FILE_FLAG");
          for (cmSourceFile* sf : sources) {
            if (sf->GetExtension() == "def") {
              linkFlags += defFlag;
              linkFlags += this->ConvertToOutputFormat(
                cmSystemTools::CollapseFullPath(sf->GetFullPath()), SHELL);
              linkFlags += " ";
            }
          }
        }
      }

      const char* targetLinkFlags = target->GetProperty("LINK_FLAGS");
      if (targetLinkFlags) {
        linkFlags += targetLinkFlags;
        linkFlags += " ";
      }
      if (!buildType.empty()) {
        std::string configLinkFlags = "LINK_FLAGS_";
        configLinkFlags += buildType;
        targetLinkFlags = target->GetProperty(configLinkFlags);
        if (targetLinkFlags) {
          linkFlags += targetLinkFlags;
          linkFlags += " ";
        }
      }

      std::vector<std::string> opts;
      target->GetLinkOptions(opts, config, linkLanguage);
      // LINK_OPTIONS are escaped.
      this->AppendCompileOptions(linkFlags, opts);
      if (pcli) {
        this->OutputLinkLibraries(pcli, linkLineComputer, linkLibs,
                                  frameworkPath, linkPath);
      }
    } break;
    case cmStateEnums::EXECUTABLE: {
      if (linkLanguage != "Swift") {
        linkFlags +=
          this->Makefile->GetSafeDefinition("CMAKE_EXE_LINKER_FLAGS");
        linkFlags += " ";
        if (!buildType.empty()) {
          std::string build = "CMAKE_EXE_LINKER_FLAGS_";
          build += buildType;
          linkFlags += this->Makefile->GetSafeDefinition(build);
          linkFlags += " ";
        }
        if (linkLanguage.empty()) {
          cmSystemTools::Error(
            "CMake can not determine linker language for target: " +
            target->GetName());
          return;
        }

        if (target->GetPropertyAsBool("WIN32_EXECUTABLE")) {
          linkFlags +=
            this->Makefile->GetSafeDefinition("CMAKE_CREATE_WIN32_EXE");
          linkFlags += " ";
        } else {
          linkFlags +=
            this->Makefile->GetSafeDefinition("CMAKE_CREATE_CONSOLE_EXE");
          linkFlags += " ";
        }

        if (target->IsExecutableWithExports()) {
          std::string exportFlagVar = "CMAKE_EXE_EXPORTS_";
          exportFlagVar += linkLanguage;
          exportFlagVar += "_FLAG";

          linkFlags += this->Makefile->GetSafeDefinition(exportFlagVar);
          linkFlags += " ";
        }
      }

      this->AddLanguageFlagsForLinking(flags, target, linkLanguage, buildType);
      if (pcli) {
        this->OutputLinkLibraries(pcli, linkLineComputer, linkLibs,
                                  frameworkPath, linkPath);
      }

      if (cmSystemTools::IsOn(
            this->Makefile->GetDefinition("BUILD_SHARED_LIBS"))) {
        std::string sFlagVar = std::string("CMAKE_SHARED_BUILD_") +
          linkLanguage + std::string("_FLAGS");
        linkFlags += this->Makefile->GetSafeDefinition(sFlagVar);
        linkFlags += " ";
      }

      std::string cmp0065Flags =
        this->GetLinkLibsCMP0065(linkLanguage, *target);
      if (!cmp0065Flags.empty()) {
        linkFlags += cmp0065Flags;
        linkFlags += " ";
      }

      const char* targetLinkFlags = target->GetProperty("LINK_FLAGS");
      if (targetLinkFlags) {
        linkFlags += targetLinkFlags;
        linkFlags += " ";
      }
      if (!buildType.empty()) {
        std::string configLinkFlags = "LINK_FLAGS_";
        configLinkFlags += buildType;
        targetLinkFlags = target->GetProperty(configLinkFlags);
        if (targetLinkFlags) {
          linkFlags += targetLinkFlags;
          linkFlags += " ";
        }
      }

      std::vector<std::string> opts;
      target->GetLinkOptions(opts, config, linkLanguage);
      // LINK_OPTIONS are escaped.
      this->AppendCompileOptions(linkFlags, opts);
    } break;
    default:
      break;
  }

  this->AppendPositionIndependentLinkerFlags(linkFlags, target, config,
                                             linkLanguage);
  this->AppendIPOLinkerFlags(linkFlags, target, config, linkLanguage);
}